

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

bool __thiscall QFormLayoutItem::isHidden(QFormLayoutItem *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  bVar1 = true;
  if (this->isVisible == true) {
    iVar2 = (*this->item->_vptr_QLayoutItem[0xd])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      bVar1 = false;
    }
    else {
      iVar2 = (*this->item->_vptr_QLayoutItem[0xd])();
      bVar1 = (bool)(*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x20) + 10) & 1);
    }
  }
  return bVar1;
}

Assistant:

bool isHidden() const { return !isVisible || (widget() && widget()->isHidden()); }